

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AppendLinkedResource
               (cmGeneratedFileStream *fout,string *name,string *path,LinkType linkType)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  string local_70;
  string local_50;
  
  pcVar2 = "location";
  if (linkType == VirtualFolder) {
    pcVar2 = "locationURI";
  }
  pcVar3 = "2";
  if (linkType == LinkToFile) {
    pcVar3 = "1";
  }
  poVar1 = std::operator<<((ostream *)fout,"\t\t<link>\n\t\t\t<name>");
  EscapeForXML(&local_50,name);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,"</name>\n\t\t\t<type>");
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"</type>\n\t\t\t<");
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,">");
  EscapeForXML(&local_70,path);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  poVar1 = std::operator<<(poVar1,"</");
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,">\n\t\t</link>\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator
::AppendLinkedResource (cmGeneratedFileStream& fout,
                        const std::string&     name,
                        const std::string&     path,
                        LinkType linkType)
{
  const char* locationTag = "location";
  const char* typeTag = "2";
  if (linkType == VirtualFolder) // ... and not a linked folder
    {
    locationTag = "locationURI";
    }
  if (linkType == LinkToFile)
    {
    typeTag = "1";
    }

  fout <<
    "\t\t<link>\n"
    "\t\t\t<name>"
    << cmExtraEclipseCDT4Generator::EscapeForXML(name)
    << "</name>\n"
    "\t\t\t<type>" << typeTag << "</type>\n"
    "\t\t\t<" << locationTag << ">"
    << cmExtraEclipseCDT4Generator::EscapeForXML(path)
    << "</" << locationTag << ">\n"
    "\t\t</link>\n"
    ;
}